

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles2::Functional::DepthStencilCaseUtil::generateDepthVisualizeCommands
               (TestRenderTarget *target,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *commands)

{
  Vector<bool,_4> local_c0;
  Vector<float,_4> local_bc;
  undefined1 local_ac [16];
  undefined1 local_9c [8];
  RenderCommand cmd;
  int ndx;
  float colorStep;
  int numSteps;
  float epsilon;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
  *commands_local;
  TestRenderTarget *target_local;
  
  cmd.colorMask.m_data[0] = false;
  cmd.colorMask.m_data[1] = false;
  cmd.colorMask.m_data[2] = true;
  cmd.colorMask.m_data[3] = true;
  for (cmd.color.m_data[3] = 0.0; (int)cmd.color.m_data[3] < 5;
      cmd.color.m_data[3] = (float)((int)cmd.color.m_data[3] + 1)) {
    RenderCommand::RenderCommand((RenderCommand *)local_9c);
    local_9c._0_4_ = FACETYPE_FRONT;
    rr::WindowRectangle::WindowRectangle
              ((WindowRectangle *)local_ac,0,0,target->width,target->height);
    cmd.params.depth = (float)local_ac._0_4_;
    cmd.params.depthWriteMask = (bool)local_ac[4];
    cmd.params._77_3_ = local_ac._5_3_;
    cmd.rect.left = local_ac._8_4_;
    cmd.rect.bottom = local_ac._12_4_;
    tcu::Vector<float,_4>::Vector
              (&local_bc,0.0,0.0,(float)cmd.colorMask.m_data * (float)(int)cmd.color.m_data[3],0.0);
    cmd.rect.width = (int)local_bc.m_data[0];
    cmd.rect.height = (int)local_bc.m_data[1];
    cmd.color.m_data[0] = local_bc.m_data[2];
    cmd.color.m_data[1] = local_bc.m_data[3];
    tcu::Vector<bool,_4>::Vector(&local_c0,false,false,true,false);
    cmd.color.m_data[2] = (float)local_c0.m_data;
    cmd.params._64_4_ = generateDepthVisualizeCommands::depthSteps[(int)cmd.color.m_data[3]] + -0.05
    ;
    cmd.params.stencil[1].depthPassOp._0_1_ = 1;
    cmd.params.stencil[1].writeMask = 0x201;
    cmd.params.depthFunc._0_1_ = 0;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ::push_back(commands,(value_type *)local_9c);
  }
  return;
}

Assistant:

void generateDepthVisualizeCommands (const TestRenderTarget& target, vector<RenderCommand>& commands)
{
	const float			epsilon			= -0.05f;
	static const float	depthSteps[]	= {-1.0f, -0.5f, 0.0f, 0.5f, 1.0f};
	int					numSteps		= DE_LENGTH_OF_ARRAY(depthSteps);
	const float			colorStep		= 1.0f / (float)(numSteps-1);

	for (int ndx = 0; ndx < numSteps; ndx++)
	{
		RenderCommand cmd;

		cmd.params.visibleFace		= rr::FACETYPE_FRONT;
		cmd.rect					= rr::WindowRectangle(0, 0, target.width, target.height);
		cmd.color					= Vec4(0.0f, 0.0f, colorStep*(float)ndx, 0.0f);
		cmd.colorMask				= tcu::BVec4(false, false, true, false);
		cmd.params.depth			= depthSteps[ndx]+epsilon;
		cmd.params.depthTestEnabled	= true;
		cmd.params.depthFunc		= GL_LESS;
		cmd.params.depthWriteMask	= false;

		commands.push_back(cmd);
	}
}